

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

Token * __thiscall Tokenizer::parseNumber(Token *__return_storage_ptr__,Tokenizer *this,char c)

{
  _Optional_payload_base<char> _Var1;
  optional<char> oVar2;
  byte *pbVar3;
  uint uVar4;
  double dVar5;
  anon_class_1_0_00000001 local_c1;
  _Uninitialized<double,_true> local_c0;
  double local_b8;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_b0;
  byte local_90 [8];
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_88;
  byte local_68 [8];
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_60;
  byte local_40 [8];
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_38;
  byte local_18 [8];
  
  _Var1._M_engaged = false;
  _Var1._M_payload._M_value = c;
  local_c0._M_storage = 0.0;
  do {
    uVar4 = (int)_Var1._M_payload._M_value - 0x30;
    if (9 < uVar4) {
      if (_Var1._M_payload._M_value != '.') goto LAB_001078f0;
      oVar2 = next(this);
      if (((ushort)oVar2.super__Optional_base<char,_true,_true>._M_payload.
                   super__Optional_payload_base<char> >> 8 & 1) == 0) {
        local_60._M_rest._0_8_ = (undefined8)(_Uninitialized<double,_true>)local_c0._M_storage;
        local_40[0] = 1;
        __return_storage_ptr__->type = Number;
        std::__detail::__variant::
        _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
        ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                           *)&__return_storage_ptr__->value,
                          (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                           *)&local_60._M_first);
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
          ::_S_vtable._M_arr[local_40[0]]._M_data)
                  (&local_c1,
                   (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                    *)&local_60);
        pbVar3 = local_40;
        goto LAB_00107930;
      }
      uVar4 = (int)oVar2.super__Optional_base<char,_true,_true>._M_payload.
                   super__Optional_payload_base<char>._M_payload - 0x30;
      if (9 < uVar4) goto LAB_001078f0;
      dVar5 = 0.1;
      goto LAB_0010795a;
    }
    local_c0._M_storage = (double)(int)uVar4 + local_c0._M_storage * 10.0;
    _Var1 = (_Optional_payload_base<char>)next(this);
  } while (((ushort)_Var1 >> 8 & 1) != 0);
  local_38._M_rest._0_8_ = (undefined8)(_Uninitialized<double,_true>)local_c0._M_storage;
  local_18[0] = 1;
  __return_storage_ptr__->type = Number;
  std::__detail::__variant::
  _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&__return_storage_ptr__->value,
                    (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&local_38._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
    ::_S_vtable._M_arr[local_18[0]]._M_data)
            (&local_c1,
             (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
              *)&local_38);
  pbVar3 = local_18;
  goto LAB_00107930;
  while( true ) {
    dVar5 = local_b8 * 0.1;
    uVar4 = (int)oVar2.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char>._M_payload - 0x30;
    if (9 < uVar4) break;
LAB_0010795a:
    local_c0._M_storage = (double)(int)uVar4 * dVar5 + local_c0._M_storage;
    local_b8 = dVar5;
    oVar2 = next(this);
    if (((ushort)oVar2.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      local_88._M_rest._0_8_ = (undefined8)(_Uninitialized<double,_true>)local_c0._M_storage;
      local_68[0] = 1;
      __return_storage_ptr__->type = Number;
      std::__detail::__variant::
      _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&__return_storage_ptr__->value,
                        (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&local_88._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
        ::_S_vtable._M_arr[local_68[0]]._M_data)
                (&local_c1,
                 (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  *)&local_88);
      pbVar3 = local_68;
      goto LAB_00107930;
    }
  }
LAB_001078f0:
  local_90[0] = 1;
  __return_storage_ptr__->type = Number;
  local_b0._M_rest._0_8_ = (undefined8)local_c0._M_storage;
  std::__detail::__variant::
  _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&__return_storage_ptr__->value,
                    (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&local_b0._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
    ::_S_vtable._M_arr[local_90[0]]._M_data)
            (&local_c1,
             (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
              *)&local_b0);
  pbVar3 = local_90;
LAB_00107930:
  *pbVar3 = 0xff;
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::parseNumber(char c) {
    optional<char> _;
    double res = 0;
    while (isdigit(c)) {
        res *= 10;
        res += c - '0';

        _ = next();
        if (!_.has_value()) {
            return Token(Number, res);
        }
        c = _.value();
    }
    if (c == '.') {
        double mult = 0.1;
        _ = next();
        if (!_.has_value()) {
            return Token(Number, res);
        }
        c = _.value();
        while (isdigit(c)) {
            res += (c - '0') * mult;
            mult *= 0.1;
            _ = next();
            if (!_.has_value()) {
                return Token(Number, res);
            }
            c = _.value();
        }
    }
    return Token(Number, res);
}